

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_type_set.cpp
# Opt level: O3

void __thiscall duckdb::IndexTypeSet::IndexTypeSet(IndexTypeSet *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  IndexType art_index_type;
  IndexType local_48;
  
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->functions)._M_h._M_buckets = &(this->functions)._M_h._M_single_bucket;
  (this->functions)._M_h._M_bucket_count = 1;
  (this->functions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->functions)._M_h._M_element_count = 0;
  (this->functions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->functions)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->functions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  paVar1 = &local_48.name.field_2;
  local_48.name._M_string_length = 0;
  local_48.name.field_2._M_local_buf[0] = '\0';
  local_48.create_plan = (index_plan_function_t)0x0;
  local_48.create_instance = (index_create_function_t)0x0;
  local_48.name._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)0x0,0x1e11b23);
  local_48.create_instance = ART::Create;
  local_48.create_plan = ART::CreatePlan;
  RegisterIndexType(this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.name._M_dataplus._M_p);
  }
  return;
}

Assistant:

IndexTypeSet::IndexTypeSet() {

	// Register the ART index type by default
	IndexType art_index_type;
	art_index_type.name = ART::TYPE_NAME;
	art_index_type.create_instance = ART::Create;
	art_index_type.create_plan = ART::CreatePlan;

	RegisterIndexType(art_index_type);
}